

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::AddPropagateStatistics::Operation<int,duckdb::TryDecimalAdd>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t value;
  int64_t value_00;
  Value local_70;
  
  iVar2 = NumericStats::GetMin<int>(lstats);
  iVar3 = NumericStats::GetMin<int>(rstats);
  if (iVar3 < 0) {
    if (iVar2 < -999999999 - iVar3) goto LAB_01085239;
LAB_0108524b:
    value_00 = (int64_t)(iVar3 + iVar2);
    bVar1 = true;
  }
  else {
    if (iVar2 <= 999999999 - iVar3) goto LAB_0108524b;
LAB_01085239:
    value_00 = 0;
    bVar1 = false;
  }
  if (!bVar1) {
    return true;
  }
  iVar2 = NumericStats::GetMax<int>(lstats);
  iVar3 = NumericStats::GetMax<int>(rstats);
  if (iVar3 < 0) {
    if (iVar2 < -999999999 - iVar3) goto LAB_0108527e;
  }
  else if (999999999 - iVar3 < iVar2) {
LAB_0108527e:
    value = 0;
    bVar1 = false;
    goto LAB_01085296;
  }
  value = (int64_t)(iVar3 + iVar2);
  bVar1 = true;
LAB_01085296:
  if (bVar1) {
    Value::Numeric(&local_70,type,value_00);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,value);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return !bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}